

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPPolicyIteration.cpp
# Opt level: O1

void __thiscall MDPPolicyIteration::Initialize(MDPPolicyIteration *this)

{
  PlanningUnitDecPOMDPDiscrete *this_00;
  size_t sVar1;
  bool bVar2;
  size_t S;
  size_t A;
  pointer pdVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  QTable tempTable;
  undefined1 local_80 [32];
  size_type local_60;
  pointer local_58;
  string local_50;
  
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"Initialize","");
  TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,(string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  this_00 = (this->super_MDPSolver)._m_pu;
  sVar1 = (this_00->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  S = PlanningUnitMADPDiscrete::GetNrStates(&this_00->super_PlanningUnitMADPDiscrete);
  A = (**(code **)((long)*(((this->super_MDPSolver)._m_pu)->super_PlanningUnitMADPDiscrete)._m_madp
                  + 0x68))();
  uVar6 = 1;
  if (sVar1 != 999999) {
    uVar6 = sVar1;
  }
  this->_m_finiteHorizon = sVar1 != 999999;
  QTable::QTable((QTable *)local_80,S,A);
  if (S != 0) {
    uVar4 = 0;
    pdVar3 = local_58;
    do {
      if (A != 0) {
        uVar5 = 0;
        do {
          pdVar3[uVar5] = 0.0;
          uVar5 = uVar5 + 1;
        } while (A != (uVar5 & 0xffffffff));
      }
      uVar4 = uVar4 + 1;
      pdVar3 = pdVar3 + local_80._16_8_;
    } while (S != uVar4);
  }
  if (uVar6 != 0) {
    uVar5 = 1;
    do {
      std::vector<QTable,_std::allocator<QTable>_>::push_back
                (&this->_m_QValues,(value_type *)local_80);
      bVar2 = uVar5 < uVar6;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  this->_m_initialized = true;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Initialize","");
  TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != 0) {
    operator_delete(local_58,local_60 << 3);
  }
  return;
}

Assistant:

void MDPPolicyIteration::Initialize()
{
    StartTimer("Initialize");


    size_t horizon = GetPU()->GetHorizon();
    size_t nrS = GetPU()->GetNrStates();
    size_t nrJA =  GetPU()->GetNrJointActions();

    size_t nrQfunctions;
    if(horizon==MAXHORIZON)
    {
        _m_finiteHorizon=false;
        nrQfunctions=1;
    }
    else
    {
        _m_finiteHorizon=true;
        nrQfunctions=horizon;
    }

    QTable tempTable(nrS,nrJA);
    for(unsigned int s=0;s!=nrS;++s)
        for(unsigned int ja=0;ja!=nrJA;++ja)
            tempTable(s,ja)=0;

    for(Index t=0; t < nrQfunctions; t++)
        _m_QValues.push_back(tempTable);

    _m_initialized = true;


    StopTimer("Initialize");
}